

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void slang::ast::createUninstantiatedDefs<slang::syntax::HierarchyInstantiationSyntax>
               (Compilation *compilation,HierarchyInstantiationSyntax *syntax,string_view moduleName
               ,ASTContext *context,
               span<const_slang::ast::Expression_*const,_18446744073709551615UL> params,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets)

{
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> params_00;
  bool bVar1;
  NetType *implicitNetNames_00;
  __extent_storage<18446744073709551615UL> _Var2;
  Compilation *compilation_00;
  HierarchicalInstanceSyntax *in_RCX;
  ASTContext *in_RDX;
  pointer ppEVar3;
  long in_RSI;
  const_iterator cVar4;
  string_view moduleName_00;
  iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*> *in_stack_00000008;
  self_type *in_stack_00000010;
  HierarchicalInstanceSyntax *instanceSyntax;
  const_iterator __end0;
  const_iterator __begin0;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *__range2;
  NetType *netType;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  implicitNetNames;
  iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*> *in_stack_fffffffffffffe28;
  self_type *in_stack_fffffffffffffe30;
  Scope *in_stack_fffffffffffffe38;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  *in_stack_fffffffffffffe40;
  HierarchyInstantiationSyntax *in_stack_fffffffffffffeb8;
  SmallVectorBase<const_slang::ast::Symbol_*> *in_stack_fffffffffffffef0;
  SmallVectorBase<const_slang::ast::Symbol_*> *in_stack_fffffffffffffef8;
  NetType *in_stack_ffffffffffffff08;
  
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::SmallSet(in_stack_fffffffffffffe40);
  not_null<const_slang::ast::Scope_*>::operator->((not_null<const_slang::ast::Scope_*> *)0x3a52d7);
  implicitNetNames_00 = Scope::getDefaultNetType(in_stack_fffffffffffffe38);
  _Var2._M_extent_value = in_RSI + 0x68;
  cVar4 = slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::begin
                    ((SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)0x3a5314);
  ppEVar3 = (pointer)cVar4.index;
  moduleName_00 =
       (string_view)
       slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::end
                 ((SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)0x3a5347);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>_>
                      (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    compilation_00 =
         (Compilation *)
         iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>,_false>
         ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>,_false>
                      *)0x3a53a4);
    params_00._M_extent._M_extent_value = _Var2._M_extent_value;
    params_00._M_ptr = ppEVar3;
    in_stack_fffffffffffffe28 = in_stack_00000008;
    in_stack_fffffffffffffe30 = in_stack_00000010;
    createUninstantiatedDef<slang::syntax::HierarchyInstantiationSyntax>
              (compilation_00,in_stack_fffffffffffffeb8,in_RCX,moduleName_00,in_RDX,params_00,
               in_stack_fffffffffffffef0,in_stack_fffffffffffffef8,
               (SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                *)implicitNetNames_00,in_stack_ffffffffffffff08);
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>,_false>
                *)in_stack_fffffffffffffe30);
  }
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::~SmallSet((SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
               *)0x3a548d);
  return;
}

Assistant:

static void createUninstantiatedDefs(Compilation& compilation, const TSyntax& syntax,
                                     std::string_view moduleName, const ASTContext& context,
                                     std::span<const Expression* const> params,
                                     SmallVectorBase<const Symbol*>& results,
                                     SmallVectorBase<const Symbol*>& implicitNets) {
    SmallSet<std::string_view, 8> implicitNetNames;
    auto& netType = context.scope->getDefaultNetType();
    for (auto instanceSyntax : syntax.instances) {
        createUninstantiatedDef(compilation, syntax, instanceSyntax, moduleName, context, params,
                                results, implicitNets, implicitNetNames, netType);
    }
}